

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  _Distance __n;
  bool bVar15;
  counting_iterator cVar4;
  
  uVar11 = this->num_digits_;
  uVar10 = (ulong)uVar11;
  iVar13 = this->exp_;
  lVar14 = (long)(int)uVar11;
  uVar7 = iVar13 + uVar11;
  uVar9 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar9 & 0xff) == 1) {
    iVar13 = (this->specs_).precision - uVar11;
    lVar2 = (ulong)(iVar13 - 1) + 1;
    if (iVar13 < 1) {
      lVar2 = 0;
    }
    bVar15 = (uVar9 >> 0x15 & 1) == 0;
    if (bVar15) {
      lVar2 = 0;
    }
    lVar12 = it.count_ - (bVar15 && (int)uVar11 < 2);
    pcVar5 = this->digits_ + ~(ulong)this->digits_ + lVar12 + 2 + lVar14;
    if ((int)uVar11 < 2) {
      pcVar5 = (char *)(lVar12 + 2);
    }
    uVar7 = uVar7 - 1;
    uVar11 = -uVar7;
    if (0 < (int)uVar7) {
      uVar11 = uVar7;
    }
    pcVar6 = pcVar5 + lVar2 + 3;
    if (uVar11 < 1000) {
      pcVar6 = pcVar5 + lVar2 + 2;
    }
    pcVar6 = pcVar6 + 1;
    if (uVar11 < 100) {
      pcVar6 = pcVar5 + lVar2 + 2;
    }
  }
  else {
    if (iVar13 < 0) {
      if ((int)uVar7 < 1) {
        iVar13 = -uVar7;
        if (uVar11 == 0) {
          iVar8 = (this->specs_).precision;
          iVar1 = iVar13;
          if (SBORROW4(iVar8,iVar13) != (int)(iVar8 + uVar7) < 0) {
            iVar1 = iVar8;
          }
          if (-1 < iVar8) {
            iVar13 = iVar1;
          }
        }
        if (0 < (int)uVar11 && (char)((uVar9 & 0x200000) >> 0x15) == '\0') {
          do {
            if (this->digits_[uVar10 - 1] != '0') goto LAB_0018421f;
            bVar15 = 1 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar15);
          uVar10 = 0;
        }
LAB_0018421f:
        iVar8 = (int)uVar10;
        if (((uVar9 & 0x200000) == 0 && iVar13 == 0) && iVar8 == 0) {
          return (counting_iterator)(it.count_ + 1);
        }
        sVar3 = it.count_ + 3 + (ulong)(iVar13 - 1);
        if (iVar13 < 1) {
          sVar3 = it.count_ + 2;
        }
        if (0 < iVar8) {
          return (counting_iterator)((long)iVar8 + sVar3);
        }
        return (counting_iterator)sVar3;
      }
      pcVar6 = this->digits_;
      uVar10 = (ulong)uVar7;
      pcVar5 = pcVar6 + uVar10 + (it.count_ - (long)pcVar6);
      if ((uVar9 >> 0x15 & 1) != 0) {
        iVar13 = (this->specs_).precision;
        iVar8 = iVar13 - uVar11;
        if (iVar8 == 0 || iVar13 < (int)uVar11) {
          return (counting_iterator)(size_t)(pcVar5 + (lVar14 - uVar10) + 1);
        }
        if (iVar8 < 1) {
          return (counting_iterator)(size_t)(pcVar5 + (lVar14 - uVar10) + 1);
        }
        return (counting_iterator)(size_t)(pcVar5 + (ulong)(iVar8 - 1) + (lVar14 - uVar10) + 2);
      }
      uVar9 = uVar11 - 1;
      if ((int)uVar7 < (int)(uVar11 - 1)) {
        uVar9 = uVar7;
      }
      do {
        if (pcVar6[lVar14 + -1] != '0') {
          uVar9 = (uint)lVar14;
          break;
        }
        lVar14 = lVar14 + -1;
      } while ((long)uVar10 < lVar14);
      pcVar6 = pcVar6 + (it.count_ - (long)pcVar6) + (long)(int)uVar9;
      if ((int)uVar9 <= (int)uVar7) {
        pcVar6 = pcVar5;
      }
      return (counting_iterator)(size_t)(pcVar6 + (uVar9 != uVar7));
    }
    lVar2 = 0;
    if (iVar13 != 0) {
      lVar2 = (ulong)(iVar13 - 1) + 1;
    }
    cVar4.count_ = lVar14 + it.count_;
    if ((int)uVar11 < 1) {
      cVar4.count_ = it.count_;
    }
    sVar3 = cVar4.count_ + lVar2;
    iVar13 = (this->specs_).precision;
    if ((iVar13 < 0 | (byte)(uVar9 >> 0x15) & 1) != 1) {
      return (counting_iterator)sVar3;
    }
    if (iVar13 - uVar7 != 0 && (int)uVar7 <= iVar13) {
      return (counting_iterator)(sVar3 + ((iVar13 - uVar7) - 1) + 2);
    }
    pcVar6 = (char *)(sVar3 - ((uVar9 & 0xff) == 2));
  }
  return (counting_iterator)(size_t)(pcVar6 + 2);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }